

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_MeshTopology::Dump(ON_MeshTopology *this,ON_TextLog *dump)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ON_3fPoint *pOVar4;
  ON_MeshTopologyEdge *pOVar5;
  ON_MeshTopologyFace *pOVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ON_MeshTopologyVertex *pOVar10;
  ulong uVar11;
  bool bVar12;
  
  lVar7 = (long)(this->m_topv).m_count;
  uVar1 = (this->m_tope).m_count;
  uVar2 = (this->m_topf).m_count;
  if (0 < lVar7) {
    lVar8 = 0;
    do {
      pOVar10 = (this->m_topv).m_a + lVar8;
      ON_TextLog::Print(dump,"topv %d: ");
      if (this->m_mesh != (ON_Mesh *)0x0) {
        iVar3 = *pOVar10->m_vi;
        pOVar4 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
        ON_TextLog::Print(dump,"{%g,%g,%g} ",(double)pOVar4[iVar3].x,(double)pOVar4[iVar3].y,
                          (double)pOVar4[iVar3].z);
      }
      ON_TextLog::Print(dump,"(");
      if (0 < pOVar10->m_v_count) {
        lVar9 = 0;
        do {
          if (lVar9 != 0) {
            ON_TextLog::Print(dump,",");
          }
          ON_TextLog::Print(dump,"m_V[%d]",(ulong)(uint)pOVar10->m_vi[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pOVar10->m_v_count);
      }
      ON_TextLog::Print(dump,") (");
      if (0 < pOVar10->m_tope_count) {
        lVar9 = 0;
        do {
          if (lVar9 != 0) {
            ON_TextLog::Print(dump,",");
          }
          ON_TextLog::Print(dump,"%d",(ulong)(uint)pOVar10->m_topei[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pOVar10->m_tope_count);
      }
      ON_TextLog::Print(dump,")\n");
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7);
  }
  if (0 < (int)uVar1) {
    uVar11 = 0;
    do {
      pOVar5 = (this->m_tope).m_a;
      ON_TextLog::Print(dump,"tope %d: topv%d to topvv%d (",uVar11 & 0xffffffff,
                        (ulong)(uint)pOVar5[uVar11].m_topvi[0],
                        (ulong)(uint)pOVar5[uVar11].m_topvi[1]);
      if (0 < pOVar5[uVar11].m_topf_count) {
        lVar7 = 0;
        do {
          if (lVar7 != 0) {
            ON_TextLog::Print(dump,",");
          }
          ON_TextLog::Print(dump,"f%d",(ulong)(uint)pOVar5[uVar11].m_topfi[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < pOVar5[uVar11].m_topf_count);
      }
      ON_TextLog::Print(dump,")\n");
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar1);
  }
  if (0 < (int)uVar2) {
    lVar7 = 0;
    uVar11 = 0;
    do {
      pOVar6 = (this->m_topf).m_a;
      ON_TextLog::Print(dump,"topf %d: (",uVar11 & 0xffffffff);
      lVar8 = 0;
      do {
        if ((int)lVar8 != 0) {
          if ((int)lVar8 == 3) {
            if (pOVar6[uVar11].m_topei[3] == pOVar6[uVar11].m_topei[2]) break;
            if (lVar8 == 0) goto LAB_0051465b;
          }
          ON_TextLog::Print(dump,",");
        }
LAB_0051465b:
        bVar12 = pOVar6->m_reve[lVar8 + lVar7] != '\0';
        ON_TextLog::Print(dump,"%ce%d",(ulong)(bVar12 + 0x2b + (uint)bVar12),
                          (ulong)*(uint *)((long)pOVar6->m_topei + lVar8 * 4 + lVar7));
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      ON_TextLog::Print(dump,")\n");
      uVar11 = uVar11 + 1;
      lVar7 = lVar7 + 0x14;
    } while (uVar11 != uVar2);
  }
  return;
}

Assistant:

void ON_MeshTopology::Dump( ON_TextLog& dump ) const
{
  ON_3fPoint p;
  int vi, ei, fi, j;
  const int topv_count = m_topv.Count();
  const int tope_count = m_tope.Count();
  const int topf_count = m_topf.Count();

  // topological vertex information
  for ( vi = 0; vi < topv_count; vi++ ) {
    const ON_MeshTopologyVertex& v = m_topv[vi];
    dump.Print("topv %d: ",vi);
    if (m_mesh) {
      // dump geometric location of this vertex
      p = m_mesh->m_V[v.m_vi[0]];
      dump.Print("{%g,%g,%g} ", p.x, p.y, p.z);
    }

    // list all mesh geometry vertices that are coincident with this
    // topological vertex
    dump.Print("(");
    for ( j = 0; j < v.m_v_count; j++ ) {
      if ( j )
        dump.Print(",");
      dump.Print("m_V[%d]",v.m_vi[j]);
    }

    // list all topological edges that begin/end at this topological vertex
    dump.Print(") (");
    for ( j = 0; j < v.m_tope_count; j++ ) {
      if ( j )
        dump.Print(",");
      dump.Print("%d",v.m_topei[j]);
    }
    dump.Print(")\n");
  }

  // topological edge information
  for ( ei = 0; ei < tope_count; ei++ ) {
    const ON_MeshTopologyEdge& e = m_tope[ei];
    dump.Print("tope %d: topv%d to topvv%d (", ei, e.m_topvi[0], e.m_topvi[1] );
    // list all mesh topological faces attached to this topological edge
    for ( j = 0; j < e.m_topf_count; j++ ) {
      if (j)
        dump.Print(",");
      dump.Print("f%d",e.m_topfi[j]);
    }
    dump.Print(")\n");
  }

  // topological face information
  // mesh m_F[] index = mesh topology m_topf[] index
  for ( fi = 0; fi < topf_count; fi++ ) {
    const ON_MeshTopologyFace& f = m_topf[fi];
    dump.Print("topf %d: (",fi);
    for ( j = 0; j < 4; j++ ) {
      if ( j == 3 && f.m_topei[3] == f.m_topei[2] )
        break; // triangular face
      if (j)
        dump.Print(",");
      dump.Print("%ce%d",f.m_reve[j]?'-':'+',f.m_topei[j]);
    }
    dump.Print(")\n");
  }
}